

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

void __thiscall SimpleString::copyToBuffer(SimpleString *this,char *bufferToCopy,size_t bufferSize)

{
  size_t sVar1;
  char *s2;
  long in_RDX;
  char *in_RSI;
  SimpleString *in_RDI;
  size_t sizeToCopy;
  size_t local_38;
  
  if ((in_RSI != (char *)0x0) && (in_RDX != 0)) {
    sVar1 = size((SimpleString *)0x17266a);
    if (in_RDX - 1U < sVar1) {
      local_38 = in_RDX - 1;
    }
    else {
      local_38 = size((SimpleString *)0x172691);
    }
    s2 = getBuffer(in_RDI);
    StrNCpy(in_RSI,s2,local_38);
    in_RSI[local_38] = '\0';
  }
  return;
}

Assistant:

void SimpleString::copyToBuffer(char* bufferToCopy, size_t bufferSize) const
{
    if (bufferToCopy == NULLPTR || bufferSize == 0) return;

    size_t sizeToCopy = (bufferSize-1 < size()) ? (bufferSize-1) : size();

    StrNCpy(bufferToCopy, getBuffer(), sizeToCopy);
    bufferToCopy[sizeToCopy] = '\0';
}